

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

void Eigen::internal::queryCacheSizes_intel_direct(int *l1,int *l2,int *l3)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bool local_61;
  int cache_size;
  int sets;
  int line_size;
  int partitions;
  int ways;
  int cache_level;
  int cache_type;
  int cache_id;
  int abcd [4];
  int *l3_local;
  int *l2_local;
  int *l1_local;
  
  *l3 = 0;
  *l2 = 0;
  *l1 = 0;
  cache_level = 0;
  do {
    puVar1 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
    uVar2 = puVar1[1];
    uVar3 = *puVar1 & 0xf;
    if ((uVar3 == 1) || (uVar3 == 3)) {
      uVar4 = *puVar1 >> 5 & 7;
      iVar5 = ((uVar2 >> 0x16) + 1) * (((uVar2 & 0x3ff000) >> 0xc) + 1) * ((uVar2 & 0xfff) + 1) *
              (puVar1[3] + 1);
      if (uVar4 == 1) {
        *l1 = iVar5;
      }
      else if (uVar4 == 2) {
        *l2 = iVar5;
      }
      else if (uVar4 == 3) {
        *l3 = iVar5;
      }
    }
    cache_level = cache_level + 1;
    local_61 = uVar3 != 0 && cache_level < 0x10;
  } while (local_61);
  return;
}

Assistant:

inline void queryCacheSizes_intel_direct(int& l1, int& l2, int& l3)
{
  int abcd[4];
  l1 = l2 = l3 = 0;
  int cache_id = 0;
  int cache_type = 0;
  do {
    abcd[0] = abcd[1] = abcd[2] = abcd[3] = 0;
    EIGEN_CPUID(abcd,0x4,cache_id);
    cache_type  = (abcd[0] & 0x0F) >> 0;
    if(cache_type==1||cache_type==3) // data or unified cache
    {
      int cache_level = (abcd[0] & 0xE0) >> 5;  // A[7:5]
      int ways        = (abcd[1] & 0xFFC00000) >> 22; // B[31:22]
      int partitions  = (abcd[1] & 0x003FF000) >> 12; // B[21:12]
      int line_size   = (abcd[1] & 0x00000FFF) >>  0; // B[11:0]
      int sets        = (abcd[2]);                    // C[31:0]

      int cache_size = (ways+1) * (partitions+1) * (line_size+1) * (sets+1);

      switch(cache_level)
      {
        case 1: l1 = cache_size; break;
        case 2: l2 = cache_size; break;
        case 3: l3 = cache_size; break;
        default: break;
      }
    }
    cache_id++;
  } while(cache_type>0 && cache_id<16);
}